

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::RepeatedStringView::GeneratePrivateMembers
          (RepeatedStringView *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    pcVar2 = "\n        $pbi$::RawPtr<$pb$::RepeatedPtrField<std::string>> $name$_;\n      ";
    uVar1 = 0x4b;
  }
  else {
    pcVar2 = "\n        $pb$::RepeatedPtrField<std::string> $name$_;\n      ";
    uVar1 = 0x3c;
  }
  google::protobuf::io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void GeneratePrivateMembers(io::Printer* p) const override {
    if (should_split()) {
      p->Emit(R"cc(
        $pbi$::RawPtr<$pb$::RepeatedPtrField<std::string>> $name$_;
      )cc");
    } else {
      p->Emit(R"cc(
        $pb$::RepeatedPtrField<std::string> $name$_;
      )cc");
    }
  }